

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void generateSortTail(Parse *pParse,Select *p,Vdbe *v,int nColumn,SelectDest *pDest)

{
  u8 uVar1;
  int iTo;
  int p1;
  int p1_00;
  ExprList *pEVar2;
  int p2;
  int iContinue;
  int p2_00;
  int p2_01;
  int iVar3;
  int local_6c;
  int i;
  int ptab2;
  int regSortOut;
  int regRowid;
  int regRow;
  int iParm;
  int eDest;
  ExprList *pOrderBy;
  int pseudoTab;
  int iTab;
  int addr;
  int addrContinue;
  int addrBreak;
  SelectDest *pDest_local;
  int nColumn_local;
  Vdbe *v_local;
  Select *p_local;
  Parse *pParse_local;
  
  p2 = sqlite3VdbeMakeLabel(v);
  iContinue = sqlite3VdbeMakeLabel(v);
  pOrderBy._4_4_ = 0;
  pEVar2 = p->pOrderBy;
  uVar1 = pDest->eDest;
  iTo = pDest->iSDParm;
  p1 = pEVar2->iECursor;
  p2_00 = sqlite3GetTempReg(pParse);
  if ((uVar1 == '\x05') || (uVar1 == '\n')) {
    pOrderBy._4_4_ = pParse->nTab;
    pParse->nTab = pOrderBy._4_4_ + 1;
    sqlite3VdbeAddOp3(v,0x2c,pOrderBy._4_4_,p2_00,nColumn);
    ptab2 = 0;
  }
  else {
    ptab2 = sqlite3GetTempReg(pParse);
  }
  if ((p->selFlags & 0x40) == 0) {
    iVar3 = sqlite3VdbeAddOp2(v,0x47,p1,p2);
    codeOffset(v,p,iContinue);
    sqlite3VdbeAddOp3(v,0x1d,p1,pEVar2->nExpr + 1,p2_00);
  }
  else {
    p2_01 = pParse->nMem + 1;
    pParse->nMem = p2_01;
    p1_00 = pParse->nTab;
    pParse->nTab = p1_00 + 1;
    sqlite3VdbeAddOp3(v,0x2c,p1_00,p2_01,pEVar2->nExpr + 2);
    iVar3 = sqlite3VdbeAddOp2(v,0x46,p1,p2);
    codeOffset(v,p,iContinue);
    sqlite3VdbeAddOp2(v,0x3e,p1,p2_01);
    sqlite3VdbeAddOp3(v,0x1d,p1_00,pEVar2->nExpr + 1,p2_00);
    sqlite3VdbeChangeP5(v,' ');
  }
  pseudoTab = iVar3 + 1;
  if (uVar1 == '\x06') {
    sqlite3ExprCodeMove(pParse,p2_00,iTo,1);
  }
  else if (uVar1 == '\a') {
    sqlite3VdbeAddOp4(v,0x1f,p2_00,1,ptab2,&pDest->affSdst,1);
    sqlite3ExprCacheAffinityChange(pParse,p2_00,1);
    sqlite3VdbeAddOp2(v,0x61,iTo,ptab2);
  }
  else if (uVar1 == '\b' || uVar1 == '\t') {
    sqlite3VdbeAddOp2(v,0x38,iTo,ptab2);
    sqlite3VdbeAddOp3(v,0x39,iTo,p2_00,ptab2);
    sqlite3VdbeChangeP5(v,'\b');
  }
  else {
    for (local_6c = 0; local_6c < nColumn; local_6c = local_6c + 1) {
      sqlite3VdbeAddOp3(v,0x1d,pOrderBy._4_4_,local_6c,pDest->iSdst + local_6c);
      if (local_6c == 0) {
        sqlite3VdbeChangeP5(v,' ');
      }
    }
    if (uVar1 == '\x05') {
      sqlite3VdbeAddOp2(v,0x10,pDest->iSdst,nColumn);
      sqlite3ExprCacheAffinityChange(pParse,pDest->iSdst,nColumn);
    }
    else {
      sqlite3VdbeAddOp1(v,4,pDest->iSDParm);
    }
  }
  sqlite3ReleaseTempReg(pParse,p2_00);
  sqlite3ReleaseTempReg(pParse,ptab2);
  sqlite3VdbeResolveLabel(v,iContinue);
  if ((p->selFlags & 0x40) == 0) {
    sqlite3VdbeAddOp2(v,0x5f,p1,pseudoTab);
  }
  else {
    sqlite3VdbeAddOp2(v,0x51,p1,pseudoTab);
  }
  sqlite3VdbeResolveLabel(v,p2);
  if ((uVar1 == '\x05') || (uVar1 == '\n')) {
    sqlite3VdbeAddOp2(v,0x2d,pOrderBy._4_4_,0);
  }
  return;
}

Assistant:

static void generateSortTail(
  Parse *pParse,    /* Parsing context */
  Select *p,        /* The SELECT statement */
  Vdbe *v,          /* Generate code into this VDBE */
  int nColumn,      /* Number of columns of data */
  SelectDest *pDest /* Write the sorted results here */
){
  int addrBreak = sqlite3VdbeMakeLabel(v);     /* Jump here to exit loop */
  int addrContinue = sqlite3VdbeMakeLabel(v);  /* Jump here for next cycle */
  int addr;
  int iTab;
  int pseudoTab = 0;
  ExprList *pOrderBy = p->pOrderBy;

  int eDest = pDest->eDest;
  int iParm = pDest->iSDParm;

  int regRow;
  int regRowid;

  iTab = pOrderBy->iECursor;
  regRow = sqlite3GetTempReg(pParse);
  if( eDest==SRT_Output || eDest==SRT_Coroutine ){
    pseudoTab = pParse->nTab++;
    sqlite3VdbeAddOp3(v, OP_OpenPseudo, pseudoTab, regRow, nColumn);
    regRowid = 0;
  }else{
    regRowid = sqlite3GetTempReg(pParse);
  }
  if( p->selFlags & SF_UseSorter ){
    int regSortOut = ++pParse->nMem;
    int ptab2 = pParse->nTab++;
    sqlite3VdbeAddOp3(v, OP_OpenPseudo, ptab2, regSortOut, pOrderBy->nExpr+2);
    addr = 1 + sqlite3VdbeAddOp2(v, OP_SorterSort, iTab, addrBreak);
    codeOffset(v, p, addrContinue);
    sqlite3VdbeAddOp2(v, OP_SorterData, iTab, regSortOut);
    sqlite3VdbeAddOp3(v, OP_Column, ptab2, pOrderBy->nExpr+1, regRow);
    sqlite3VdbeChangeP5(v, OPFLAG_CLEARCACHE);
  }else{
    addr = 1 + sqlite3VdbeAddOp2(v, OP_Sort, iTab, addrBreak);
    codeOffset(v, p, addrContinue);
    sqlite3VdbeAddOp3(v, OP_Column, iTab, pOrderBy->nExpr+1, regRow);
  }
  switch( eDest ){
    case SRT_Table:
    case SRT_EphemTab: {
      testcase( eDest==SRT_Table );
      testcase( eDest==SRT_EphemTab );
      sqlite3VdbeAddOp2(v, OP_NewRowid, iParm, regRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, iParm, regRow, regRowid);
      sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
      break;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case SRT_Set: {
      assert( nColumn==1 );
      sqlite3VdbeAddOp4(v, OP_MakeRecord, regRow, 1, regRowid,
                        &pDest->affSdst, 1);
      sqlite3ExprCacheAffinityChange(pParse, regRow, 1);
      sqlite3VdbeAddOp2(v, OP_IdxInsert, iParm, regRowid);
      break;
    }
    case SRT_Mem: {
      assert( nColumn==1 );
      sqlite3ExprCodeMove(pParse, regRow, iParm, 1);
      /* The LIMIT clause will terminate the loop for us */
      break;
    }
#endif
    default: {
      int i;
      assert( eDest==SRT_Output || eDest==SRT_Coroutine ); 
      testcase( eDest==SRT_Output );
      testcase( eDest==SRT_Coroutine );
      for(i=0; i<nColumn; i++){
        assert( regRow!=pDest->iSdst+i );
        sqlite3VdbeAddOp3(v, OP_Column, pseudoTab, i, pDest->iSdst+i);
        if( i==0 ){
          sqlite3VdbeChangeP5(v, OPFLAG_CLEARCACHE);
        }
      }
      if( eDest==SRT_Output ){
        sqlite3VdbeAddOp2(v, OP_ResultRow, pDest->iSdst, nColumn);
        sqlite3ExprCacheAffinityChange(pParse, pDest->iSdst, nColumn);
      }else{
        sqlite3VdbeAddOp1(v, OP_Yield, pDest->iSDParm);
      }
      break;
    }
  }
  sqlite3ReleaseTempReg(pParse, regRow);
  sqlite3ReleaseTempReg(pParse, regRowid);

  /* The bottom of the loop
  */
  sqlite3VdbeResolveLabel(v, addrContinue);
  if( p->selFlags & SF_UseSorter ){
    sqlite3VdbeAddOp2(v, OP_SorterNext, iTab, addr);
  }else{
    sqlite3VdbeAddOp2(v, OP_Next, iTab, addr);
  }
  sqlite3VdbeResolveLabel(v, addrBreak);
  if( eDest==SRT_Output || eDest==SRT_Coroutine ){
    sqlite3VdbeAddOp2(v, OP_Close, pseudoTab, 0);
  }
}